

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_direct.c
# Opt level: O3

void SetToZero(DlsMat A)

{
  long lVar1;
  long lVar2;
  realtype **pprVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  if (A->type == 2) {
    lVar1 = A->M;
    if (0 < lVar1) {
      lVar2 = A->mu;
      lVar5 = A->s_mu;
      lVar6 = A->ml + lVar2;
      pprVar3 = A->cols;
      lVar4 = 0;
      do {
        if (-1 < lVar6) {
          memset(pprVar3[lVar4] + (lVar5 - lVar2),0,lVar6 * 8 + 8);
        }
        lVar4 = lVar4 + 1;
      } while (lVar1 != lVar4);
    }
  }
  else if ((A->type == 1) && (lVar1 = A->N, 0 < lVar1)) {
    lVar2 = A->M;
    pprVar3 = A->cols;
    lVar5 = 0;
    do {
      if (0 < lVar2) {
        memset(pprVar3[lVar5],0,lVar2 * 8);
      }
      lVar5 = lVar5 + 1;
    } while (lVar1 != lVar5);
  }
  return;
}

Assistant:

void SetToZero(DlsMat A)
{
  sunindextype i, j, colSize;
  realtype *col_j;

  switch (A->type) {

  case SUNDIALS_DENSE:
    
    for (j=0; j<A->N; j++) {
      col_j = A->cols[j];
      for (i=0; i<A->M; i++)
        col_j[i] = ZERO;
    }

    break;

  case SUNDIALS_BAND:

    colSize = A->mu + A->ml + 1;
    for (j=0; j<A->M; j++) {
      col_j = A->cols[j] + A->s_mu - A->mu;
      for (i=0; i<colSize; i++)
        col_j[i] = ZERO;
    }

    break;

  }

}